

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

float dyy(qnode_ptr_t q,int x,int y,int z)

{
  param512_t *papVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  float fVar7;
  
  iVar4 = C.m;
  iVar5 = (C.m - (C.m >> 0x1f) & 0xfffffffeU) + q->ofst;
  lVar2 = (long)(q->res * x + y);
  papVar1 = q->param_ptr[z];
  piVar6 = &(*papVar1)[lVar2].err;
  if ((((y < iVar5) || (x < iVar5)) || (q->sizy - iVar5 <= x)) || (q->sizx - iVar5 <= y)) {
    *piVar6 = 1;
    fVar7 = 0.0;
  }
  else {
    *piVar6 = 0;
    fVar7 = 0.0;
    if (-2 < iVar4) {
      iVar4 = iVar4 / 2;
      iVar5 = -iVar4;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      iVar5 = iVar5 + iVar4 + 1;
      lVar3 = 0;
      do {
        fVar7 = fVar7 + *(float *)((long)papVar1 +
                                  lVar3 * 8 + lVar2 * 0x20 + (long)iVar4 * -0x20 + 0x14) *
                        *(float *)((long)C.k + lVar3);
        lVar3 = lVar3 + 4;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    fVar7 = fVar7 / C.f;
  }
  return fVar7;
}

Assistant:

float dyy(q,x,y,z)
qnode_ptr_t q ;
int x, y, z ;

{ extern kernel_t C ;
  float d ;
  int i, h ;

  h = C.m/2 ;
  d = 0.0 ;

  if (overflow(x,y,q->sizy,q->sizx,q->ofst,h,2)) {
    (*q->param_ptr[z])[q->res*x + y].err = SA_OVERFLOW ;
  }
  else {
    (*q->param_ptr[z])[q->res*x + y].err = NO_ERROR ;
    for (i = -h ; i <= h ; i++) {
      d += (*q->param_ptr[z])[q->res*x + y+i].fy*C.k[i+h] ;
    }
    d /= C.f ;
  }
  return(d) ;
}